

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

void __thiscall TTD::EventLog::InitForTTDRecord(EventLog *this,bool debug)

{
  PropertyId PVar1;
  PropertyRecord *record;
  PropertyRecord *pRecord;
  PropertyId pid;
  bool debug_local;
  EventLog *this_local;
  
  pRecord._0_4_ = 0x2d9;
  while( true ) {
    PVar1 = ThreadContext::GetMaxPropertyId(this->m_threadContext);
    if (PVar1 <= (int)pRecord) break;
    record = ThreadContext::GetPropertyName(this->m_threadContext,(int)pRecord);
    AddPropertyRecord(this,record);
    pRecord._0_4_ = (int)pRecord + 1;
  }
  SetGlobalMode(this,RecordMode);
  if (debug) {
    PushMode(this,DebuggerAttachedMode);
  }
  return;
}

Assistant:

void EventLog::InitForTTDRecord(bool debug)
    {
        //pin all the current properties so they don't move/disappear on us
        for(Js::PropertyId pid = TotalNumberOfBuiltInProperties; pid < this->m_threadContext->GetMaxPropertyId(); ++pid)
        {
            const Js::PropertyRecord* pRecord = this->m_threadContext->GetPropertyName(pid);
            this->AddPropertyRecord(pRecord);
        }

        this->SetGlobalMode(TTDMode::RecordMode);
        if (debug)
        {
            this->PushMode(TTDMode::DebuggerAttachedMode);
        }
    }